

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

int __thiscall amrex::EB2::Level::coarsenFromFine(Level *this,Level *fineLevel,bool fill_boundary)

{
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  uint *puVar4;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  long lVar5;
  Periodicity PVar6;
  bool b_1;
  int tile_error_1;
  Box *ndgbx;
  Box *bx_5;
  Array4<const_amrex::EBCellFlag> *fflag;
  Array4<const_double> *fecz;
  Array4<const_double> *fecy;
  Array4<const_double> *fecx;
  Array4<const_double> *ffcz;
  Array4<const_double> *ffcy;
  Array4<const_double> *ffcx;
  Array4<const_double> *fapz;
  Array4<const_double> *fapy;
  Array4<const_double> *fapx;
  Array4<const_double> *fbn;
  Array4<const_double> *fbc;
  Array4<const_double> *fba;
  Array4<const_double> *fcent;
  Array4<const_double> *fvol;
  Array4<amrex::EBCellFlag> *cflag_1;
  Array4<double> *cecz;
  Array4<double> *cecy;
  Array4<double> *cecx;
  Array4<double> *cfcz;
  Array4<double> *cfcy;
  Array4<double> *cfcx;
  Array4<double> *capz;
  Array4<double> *capy;
  Array4<double> *capx;
  Array4<double> *cbn;
  Array4<double> *cbc;
  Array4<double> *cba;
  Array4<double> *ccent;
  Array4<double> *cvol;
  MFIter mfi_2;
  int error;
  IntVect cell;
  int i_1;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box bx_4;
  Box *zbx;
  Box bx_3;
  Box *ybx;
  Box bx_2;
  Box *xbx;
  Box bx_1;
  Box *indbox;
  Box *ibox;
  pair<int,_amrex::Box> *is;
  iterator __end6;
  iterator __begin6;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range6;
  IntVect *iv;
  const_iterator __end5;
  const_iterator __begin5;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range5;
  Array4<double> *apz;
  Array4<double> *apy;
  Array4<double> *apx;
  Array4<amrex::EBCellFlag> *cflag;
  Array4<double> *vfrac;
  Box *bx;
  MFIter mfi_1;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  int idim_1;
  Periodicity *fine_period;
  Geometry *fine_geom;
  Array<MultiFab,_3> *f_edgecent;
  Array<MultiFab,_3> *f_facecent;
  Array<MultiFab,_3> *f_areafrac;
  MultiFab *f_bndrynorm;
  MultiFab *f_bndrycent;
  MultiFab *f_bndryarea;
  MultiFab *f_centroid;
  MultiFab *f_volfrac;
  FabArray<amrex::EBCellFlagFab> *f_cellflag;
  IntVect edge_type;
  int idim;
  int ng;
  bool b;
  int tile_error;
  Array4<const_double> *fine;
  Array4<double> *crse;
  Box *ndbx;
  Box *ccbx;
  MFIter mfi;
  int mvmc_error;
  MultiFab *f_levelset;
  DistributionMapping *fine_dmap;
  BoxArray *fine_covered_grids;
  BoxArray *fine_grids;
  int i;
  BoxArray *in_stack_ffffffffffffdce8;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *this_00;
  undefined8 *puVar7;
  Long *__n;
  BoxArray *in_stack_ffffffffffffdcf0;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffdcf8;
  MFIter *in_stack_ffffffffffffdd00;
  MFIter *this_01;
  BoxArray *in_stack_ffffffffffffdd08;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffdd10;
  undefined8 *puVar8;
  FabArrayBase *in_stack_ffffffffffffdd18;
  Geometry *in_stack_ffffffffffffdd20;
  undefined1 *puVar9;
  BoxArray *in_stack_ffffffffffffdd28;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffdd30;
  anon_class_1960_32_a2ac1a33 *f;
  BoxArray *in_stack_ffffffffffffdd38;
  Box *bx_00;
  MultiFab *in_stack_ffffffffffffdd40;
  Periodicity *in_stack_ffffffffffffdd48;
  MFIter *in_stack_ffffffffffffdd50;
  IntVect *in_stack_ffffffffffffdd58;
  MFIter *in_stack_ffffffffffffdd60;
  bool local_1f81;
  int *local_1f80;
  undefined8 uStack_1f78;
  undefined4 uStack_1f70;
  undefined4 local_1f6c;
  undefined4 uStack_1f68;
  undefined8 uStack_1f64;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 uStack_1f38;
  undefined4 uStack_1f30;
  undefined4 local_1f2c;
  undefined4 uStack_1f28;
  undefined8 uStack_1f24;
  _func_int **local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 uStack_1ef8;
  undefined4 uStack_1ef0;
  undefined4 local_1eec;
  undefined4 uStack_1ee8;
  undefined8 uStack_1ee4;
  FabArrayBase *local_1ed8;
  FabArrayBase *pFStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 uStack_1eb8;
  undefined4 uStack_1eb0;
  undefined4 local_1eac;
  undefined4 uStack_1ea8;
  undefined8 uStack_1ea4;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 uStack_1e78;
  undefined4 uStack_1e70;
  undefined4 local_1e6c;
  undefined4 uStack_1e68;
  undefined8 uStack_1e64;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 uStack_1e38;
  undefined4 uStack_1e30;
  undefined4 local_1e2c;
  undefined4 uStack_1e28;
  undefined8 uStack_1e24;
  undefined8 local_1e18;
  Level *in_stack_ffffffffffffe1f0;
  int local_17d8;
  undefined1 local_17d4 [28];
  undefined1 *local_17b8;
  undefined8 local_17ac [3];
  undefined8 *local_1790;
  undefined1 local_1788 [64];
  undefined1 *local_1748;
  undefined1 local_1740 [64];
  undefined1 *local_1700;
  undefined1 local_16f8 [64];
  undefined1 *local_16b8;
  undefined1 local_16b0 [64];
  undefined1 *local_1670;
  undefined1 local_1668 [64];
  undefined1 *local_1628;
  undefined1 local_1620 [64];
  undefined1 *local_15e0;
  undefined1 local_15d8 [64];
  undefined1 *local_1598;
  undefined1 local_1590 [64];
  undefined1 *local_1550;
  undefined1 local_1548 [64];
  undefined1 *local_1508;
  undefined1 local_1500 [64];
  undefined1 *local_14c0;
  undefined1 local_14b8 [64];
  undefined1 *local_1478;
  undefined1 local_1470 [64];
  undefined1 *local_1430;
  undefined1 local_1428 [64];
  undefined1 *local_13e8;
  undefined1 local_13e0 [64];
  undefined1 *local_13a0;
  undefined1 local_1398 [64];
  undefined1 *local_1358;
  undefined1 local_1350 [64];
  undefined1 *local_1310;
  undefined1 local_1308 [64];
  undefined1 *local_12c8;
  undefined1 local_12c0 [64];
  undefined1 *local_1280;
  undefined1 local_1278 [64];
  undefined1 *local_1238;
  undefined1 local_1230 [64];
  undefined1 *local_11f0;
  undefined1 local_11e8 [64];
  undefined1 *local_11a8;
  Box local_11a0 [2];
  Box *local_1160;
  undefined1 local_1158 [144];
  undefined8 local_10c8 [8];
  undefined8 *local_1088;
  undefined8 local_1080 [8];
  undefined8 *local_1040;
  undefined8 local_1038 [8];
  undefined8 *local_ff8;
  undefined1 local_ff0 [136];
  FabArray<amrex::EBCellFlagFab> *local_f68;
  undefined1 local_f60 [168];
  uint local_eb8;
  uint32_t local_eb4;
  IntVect local_eb0;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  Dim3 local_e84 [2];
  int local_e68;
  int iStack_e64;
  Box local_e5c;
  Box *local_e40;
  Box local_e34;
  Box *local_e18;
  Box local_e0c;
  Box *local_df0;
  int local_de4;
  int iStack_de0;
  int local_ddc;
  int aiStack_dd8 [3];
  undefined1 local_dcc [4];
  int *local_dc8;
  Box local_dbc;
  Box *local_da0;
  reference local_d98;
  pair<int,_amrex::Box> *local_d90;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_d88;
  undefined1 *local_d80;
  reference local_d58;
  IntVect *local_d50;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_d48;
  undefined1 *local_d40;
  long local_d38 [8];
  long *local_cf8;
  double local_cf0 [8];
  double *local_cb0;
  long local_ca8 [8];
  long *local_c68;
  long local_c60 [8];
  long *local_c20;
  long local_c18 [8];
  long *local_bd8;
  double local_bcc [3];
  double *local_bb0;
  MFIter local_ba8;
  undefined1 local_b48 [24];
  undefined1 local_b30 [24];
  undefined1 *local_b18;
  int local_b0c;
  IntVect local_b08;
  undefined8 local_af4;
  int local_aec;
  undefined8 *local_ae8;
  long local_ae0;
  long local_ad8;
  long local_ad0;
  long local_ac8;
  long local_ac0;
  long local_ab8;
  double *local_ab0;
  long local_aa8;
  long local_aa0;
  long local_a98;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_a90;
  undefined8 local_a78;
  double *pdStack_a70;
  Long local_a68;
  undefined1 local_a58 [108];
  IntVect local_9ec;
  Long local_9e0 [2];
  undefined1 auStack_9d0 [16];
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  int local_9a8 [2];
  int local_9a0;
  int local_998 [2];
  int local_990;
  undefined1 local_988 [104];
  undefined8 local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  int local_8f0 [2];
  int local_8e8;
  int local_8e0 [2];
  int local_8d8;
  undefined1 local_8d0 [108];
  int local_864;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_860;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined4 local_740;
  bool local_739;
  int *local_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined4 uStack_708;
  undefined4 local_704;
  undefined4 uStack_700;
  undefined8 uStack_6fc;
  int local_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined4 uStack_6c0;
  undefined4 local_6bc;
  undefined4 uStack_6b8;
  undefined8 uStack_6b4;
  undefined8 local_668 [8];
  undefined8 *local_628;
  undefined8 local_620 [8];
  undefined8 *local_5e0;
  undefined1 local_5d4 [28];
  undefined1 *local_5b8;
  int local_5b0 [2];
  int local_5a8;
  int local_5a0 [2];
  int local_598;
  undefined1 local_594 [28];
  undefined1 *local_578;
  MFIter local_570;
  uint local_510 [4];
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  int local_4c8 [2];
  int local_4c0;
  int local_4b8 [2];
  int local_4b0;
  long local_440;
  long local_368;
  long local_360;
  long local_358;
  byte local_349;
  long local_348;
  uint local_334;
  int local_330 [2];
  int local_328;
  IntVect local_31c;
  int local_310 [2];
  int local_308;
  int local_300;
  IntVect local_2fc;
  int local_2f0 [2];
  int local_2e8;
  int local_2dc;
  IntVect local_2d8;
  int local_2cc;
  IntVect *local_2c8;
  int local_2c0 [2];
  int local_2b8;
  IntVect local_2ac;
  Box *local_2a0;
  undefined4 local_294;
  Box *local_290;
  undefined4 local_284;
  Box *local_280;
  undefined4 local_274;
  Box *local_270;
  int *local_258;
  int *local_230;
  int local_21c;
  int local_218;
  int local_214;
  long *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  double *local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  EBCellFlag local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  long *local_1b0;
  undefined4 local_1a4;
  int *local_1a0;
  undefined4 local_194;
  int *local_190;
  undefined4 local_184;
  int *local_180;
  undefined4 local_174;
  int *local_170;
  undefined4 local_164;
  int *local_160;
  undefined4 local_154;
  int *local_150;
  int local_144;
  int *local_140;
  int local_134;
  undefined1 *local_130;
  undefined4 local_128;
  int local_124;
  int *local_120;
  int local_114;
  undefined1 *local_110;
  int local_104;
  undefined1 *local_100;
  undefined4 local_f4;
  Box *local_f0;
  undefined4 local_e4;
  IndexType *local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  IntVect *local_d0;
  undefined4 local_c4;
  IndexType *local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  IndexType *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  Box *local_a0;
  undefined4 local_94;
  IndexType *local_90;
  undefined4 local_88;
  undefined4 local_84;
  IntVect *local_80;
  undefined4 local_74;
  IndexType *local_70;
  undefined4 local_68;
  undefined4 local_64;
  IndexType *local_60;
  undefined4 local_58;
  undefined4 local_54;
  Box *local_50;
  undefined4 local_44;
  IndexType *local_40;
  undefined4 local_38;
  undefined4 local_34;
  IntVect *local_30;
  undefined4 local_24;
  IndexType *local_20;
  undefined4 local_18;
  undefined4 local_14;
  IndexType *local_10;
  undefined4 local_4;
  
  local_349 = in_DL & 1;
  local_358 = in_RSI + 0xd8;
  local_360 = in_RSI + 0x140;
  local_368 = in_RSI + 0x1a8;
  local_348 = in_RSI;
  amrex::coarsen(in_stack_ffffffffffffdd08,(int)((ulong)in_stack_ffffffffffffdd00 >> 0x20));
  BoxArray::operator=(in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdce8);
  BoxArray::~BoxArray(in_stack_ffffffffffffdcf0);
  amrex::coarsen(in_stack_ffffffffffffdd08,(int)((ulong)in_stack_ffffffffffffdd00 >> 0x20));
  BoxArray::operator=(in_stack_ffffffffffffdcf0,in_stack_ffffffffffffdce8);
  BoxArray::~BoxArray(in_stack_ffffffffffffdcf0);
  DistributionMapping::operator=
            ((DistributionMapping *)in_stack_ffffffffffffdcf0,
             (DistributionMapping *)in_stack_ffffffffffffdce8);
  bVar2 = BoxArray::coarsenable
                    ((BoxArray *)in_stack_ffffffffffffdd10,
                     (int)((ulong)in_stack_ffffffffffffdd08 >> 0x20),(int)in_stack_ffffffffffffdd08)
  ;
  if ((bVar2) &&
     ((bVar2 = BoxArray::empty((BoxArray *)0x149b87d), bVar2 ||
      (bVar2 = BoxArray::coarsenable
                         ((BoxArray *)in_stack_ffffffffffffdd10,
                          (int)((ulong)in_stack_ffffffffffffdd08 >> 0x20),
                          (int)in_stack_ffffffffffffdd08), bVar2)))) {
    local_440 = local_348 + 0x2c8;
    IntVect::IntVect(&local_31c,1);
    local_328 = local_31c.vect[2];
    local_330[0] = local_31c.vect[0];
    local_330[1] = local_31c.vect[1];
    local_4c0 = local_31c.vect[2];
    local_4c8[0] = local_31c.vect[0];
    local_4c8[1] = local_31c.vect[1];
    local_4b0 = local_31c.vect[2];
    local_4b8[0] = local_31c.vect[0];
    local_4b8[1] = local_31c.vect[1];
    convert(in_stack_ffffffffffffdd08,(IntVect *)in_stack_ffffffffffffdd00);
    local_4e8 = 0;
    uStack_4e0 = 0;
    local_4f8 = 0;
    uStack_4f0 = 0;
    local_4d8 = 0;
    MFInfo::MFInfo((MFInfo *)0x149b9ca);
    local_500 = 0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
    MultiFab::define(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                     (DistributionMapping *)in_stack_ffffffffffffdd30,
                     (int)((ulong)in_stack_ffffffffffffdd28 >> 0x20),(int)in_stack_ffffffffffffdd28,
                     (MFInfo *)in_stack_ffffffffffffdd20,
                     (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd50);
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x149ba37);
    MFInfo::~MFInfo((MFInfo *)0x149ba44);
    BoxArray::~BoxArray(in_stack_ffffffffffffdcf0);
    local_510[0] = 0;
    MFIter::MFIter((MFIter *)in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
                   SUB81((ulong)in_stack_ffffffffffffdd10 >> 0x38,0));
    while (bVar2 = MFIter::isValid(&local_570), bVar2) {
      IntVect::IntVect(&local_2ac,0);
      local_2b8 = local_2ac.vect[2];
      local_2c0[0] = local_2ac.vect[0];
      local_2c0[1] = local_2ac.vect[1];
      local_5a8 = local_2ac.vect[2];
      local_5b0[0] = local_2ac.vect[0];
      local_5b0[1] = local_2ac.vect[1];
      local_598 = local_2ac.vect[2];
      local_5a0[0] = local_2ac.vect[0];
      local_5a0[1] = local_2ac.vect[1];
      MFIter::tilebox(in_stack_ffffffffffffdd60,in_stack_ffffffffffffdd58);
      local_578 = local_594;
      MFIter::tilebox(in_stack_ffffffffffffdd50);
      local_5b8 = local_5d4;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                 (MFIter *)in_stack_ffffffffffffdcf0);
      local_5e0 = local_620;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                 (MFIter *)in_stack_ffffffffffffdcf0);
      local_6e8 = *local_5e0;
      uStack_6e0 = local_5e0[1];
      local_6d8 = local_5e0[2];
      uStack_6d0 = local_5e0[3];
      uStack_6c8 = local_5e0[4];
      uStack_6b4 = *(undefined8 *)((long)local_5e0 + 0x34);
      uStack_6b8 = (undefined4)((ulong)*(undefined8 *)((long)local_5e0 + 0x2c) >> 0x20);
      uStack_6c0 = (undefined4)local_5e0[5];
      local_6bc = (undefined4)((ulong)local_5e0[5] >> 0x20);
      local_628 = local_668;
      LoopConcurrentOnCpu<amrex::EB2::Level::coarsenFromFine(amrex::EB2::Level&,bool)::__0>
                ((Box *)in_stack_ffffffffffffdd38,
                 (anon_class_128_2_04e7277e *)in_stack_ffffffffffffdd30);
      local_6ec = 0;
      local_730 = *local_628;
      uStack_728 = local_628[1];
      local_720 = local_628[2];
      uStack_718 = local_628[3];
      uStack_710 = local_628[4];
      uStack_6fc = *(undefined8 *)((long)local_628 + 0x34);
      uStack_700 = (undefined4)((ulong)*(undefined8 *)((long)local_628 + 0x2c) >> 0x20);
      uStack_708 = (undefined4)local_628[5];
      local_704 = (undefined4)((ulong)local_628[5] >> 0x20);
      local_738 = &local_6ec;
      LoopOnCpu<amrex::EB2::Level::coarsenFromFine(amrex::EB2::Level&,bool)::__1>
                ((Box *)in_stack_ffffffffffffdd38,
                 (anon_class_72_2_2f7eaf3c *)in_stack_ffffffffffffdd30);
      puVar4 = (uint *)std::max<int>((int *)local_510,&local_6ec);
      local_510[0] = *puVar4;
      MFIter::operator++(&local_570);
    }
    MFIter::~MFIter((MFIter *)in_stack_ffffffffffffdcf0);
    local_739 = local_510[0] != 0;
    ParallelDescriptor::ReduceBoolOr(&local_739);
    local_510[0] = (uint)(local_739 & 1);
    local_334 = local_510[0];
    if (local_510[0] == 0) {
      local_740 = 2;
      local_758 = 0;
      uStack_750 = 0;
      local_768 = 0;
      uStack_760 = 0;
      local_748 = 0;
      MFInfo::MFInfo((MFInfo *)0x149be48);
      local_770 = 0;
      DefaultFabFactory<amrex::EBCellFlagFab>::DefaultFabFactory
                ((DefaultFabFactory<amrex::EBCellFlagFab> *)in_stack_ffffffffffffdcf0);
      FabArray<amrex::EBCellFlagFab>::define
                (in_stack_ffffffffffffdd30,in_stack_ffffffffffffdd28,
                 (DistributionMapping *)in_stack_ffffffffffffdd20,
                 (int)((ulong)in_stack_ffffffffffffdd18 >> 0x20),(int)in_stack_ffffffffffffdd18,
                 (MFInfo *)in_stack_ffffffffffffdd10,
                 (FabFactory<amrex::EBCellFlagFab> *)in_stack_ffffffffffffdd40);
      DefaultFabFactory<amrex::EBCellFlagFab>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::EBCellFlagFab> *)0x149beb6);
      MFInfo::~MFInfo((MFInfo *)0x149bec3);
      local_788 = 0;
      uStack_780 = 0;
      local_798 = 0;
      uStack_790 = 0;
      local_778 = 0;
      MFInfo::MFInfo((MFInfo *)0x149bf31);
      local_7a0 = 0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
      MultiFab::define(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                       (DistributionMapping *)in_stack_ffffffffffffdd30,
                       (int)((ulong)in_stack_ffffffffffffdd28 >> 0x20),
                       (int)in_stack_ffffffffffffdd28,(MFInfo *)in_stack_ffffffffffffdd20,
                       (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd50);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x149bf9f);
      MFInfo::~MFInfo((MFInfo *)0x149bfac);
      local_7b8 = 0;
      uStack_7b0 = 0;
      local_7c8 = 0;
      uStack_7c0 = 0;
      local_7a8 = 0;
      MFInfo::MFInfo((MFInfo *)0x149c01a);
      local_7d0 = 0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
      MultiFab::define(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                       (DistributionMapping *)in_stack_ffffffffffffdd30,
                       (int)((ulong)in_stack_ffffffffffffdd28 >> 0x20),
                       (int)in_stack_ffffffffffffdd28,(MFInfo *)in_stack_ffffffffffffdd20,
                       (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd50);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x149c088);
      MFInfo::~MFInfo((MFInfo *)0x149c095);
      local_7e8 = 0;
      uStack_7e0 = 0;
      local_7f8 = 0;
      uStack_7f0 = 0;
      local_7d8 = 0;
      MFInfo::MFInfo((MFInfo *)0x149c103);
      local_800 = 0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
      MultiFab::define(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                       (DistributionMapping *)in_stack_ffffffffffffdd30,
                       (int)((ulong)in_stack_ffffffffffffdd28 >> 0x20),
                       (int)in_stack_ffffffffffffdd28,(MFInfo *)in_stack_ffffffffffffdd20,
                       (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd50);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x149c171);
      MFInfo::~MFInfo((MFInfo *)0x149c17e);
      local_818 = 0;
      uStack_810 = 0;
      local_828 = 0;
      uStack_820 = 0;
      local_808 = 0;
      MFInfo::MFInfo((MFInfo *)0x149c1ec);
      local_830 = 0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
      MultiFab::define(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                       (DistributionMapping *)in_stack_ffffffffffffdd30,
                       (int)((ulong)in_stack_ffffffffffffdd28 >> 0x20),
                       (int)in_stack_ffffffffffffdd28,(MFInfo *)in_stack_ffffffffffffdd20,
                       (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd50);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x149c25a);
      MFInfo::~MFInfo((MFInfo *)0x149c267);
      local_848 = 0;
      uStack_840 = 0;
      local_860.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_860.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_838 = 0;
      MFInfo::MFInfo((MFInfo *)0x149c2d5);
      local_860.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      this_00 = &local_860;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
      MultiFab::define(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,
                       (DistributionMapping *)in_stack_ffffffffffffdd30,
                       (int)((ulong)in_stack_ffffffffffffdd28 >> 0x20),
                       (int)in_stack_ffffffffffffdd28,(MFInfo *)in_stack_ffffffffffffdd20,
                       (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdd50);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x149c343);
      MFInfo::~MFInfo((MFInfo *)0x149c350);
      for (local_864 = 0; local_864 < 3; local_864 = local_864 + 1) {
        pvVar3 = std::array<amrex::MultiFab,_3UL>::operator[]
                           ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,
                            (size_type)this_00);
        local_2dc = local_864;
        if (local_864 == 0) {
          IntVect::IntVect(&local_2d8,1,0,0);
        }
        else if (local_864 == 1) {
          IntVect::IntVect(&local_2d8,0,1,0);
        }
        else {
          IntVect::IntVect(&local_2d8,0,0,1);
        }
        local_2e8 = local_2d8.vect[2];
        local_2f0[0] = local_2d8.vect[0];
        local_2f0[1] = local_2d8.vect[1];
        local_8e8 = local_2d8.vect[2];
        local_8f0[0] = local_2d8.vect[0];
        local_8f0[1] = local_2d8.vect[1];
        local_8d8 = local_2d8.vect[2];
        local_8e0[0] = local_2d8.vect[0];
        local_8e0[1] = local_2d8.vect[1];
        convert(in_stack_ffffffffffffdd08,(IntVect *)in_stack_ffffffffffffdd00);
        local_908 = 0;
        uStack_900 = 0;
        local_918 = 0;
        uStack_910 = 0;
        local_8f8 = 0;
        MFInfo::MFInfo((MFInfo *)0x149c4d9);
        local_920 = 0;
        puVar7 = &local_920;
        DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
        (*(pvVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pvVar3,local_8d0,in_RDI + 0x1a8,1,2,&local_918);
        DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0x149c54b);
        MFInfo::~MFInfo((MFInfo *)0x149c558);
        BoxArray::~BoxArray(in_stack_ffffffffffffdcf0);
        pvVar3 = std::array<amrex::MultiFab,_3UL>::operator[]
                           ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,
                            (size_type)puVar7);
        local_300 = local_864;
        if (local_864 == 0) {
          IntVect::IntVect(&local_2fc,1,0,0);
        }
        else if (local_864 == 1) {
          IntVect::IntVect(&local_2fc,0,1,0);
        }
        else {
          IntVect::IntVect(&local_2fc,0,0,1);
        }
        local_308 = local_2fc.vect[2];
        local_310[0] = local_2fc.vect[0];
        local_310[1] = local_2fc.vect[1];
        local_9a0 = local_2fc.vect[2];
        local_9a8[0] = local_2fc.vect[0];
        local_9a8[1] = local_2fc.vect[1];
        local_990 = local_2fc.vect[2];
        local_998[0] = local_2fc.vect[0];
        local_998[1] = local_2fc.vect[1];
        convert(in_stack_ffffffffffffdd08,(IntVect *)in_stack_ffffffffffffdd00);
        auStack_9d0._8_4_ = 0;
        auStack_9d0._12_4_ = 0;
        uStack_9c0._0_4_ = 0;
        uStack_9c0._4_4_ = 0;
        local_9e0[1] = 0;
        auStack_9d0._0_4_ = 0;
        auStack_9d0._4_4_ = 0;
        local_9b8._0_4_ = 0;
        local_9b8._4_4_ = 0;
        MFInfo::MFInfo((MFInfo *)0x149c6d5);
        local_9e0[0] = 0;
        __n = local_9e0;
        DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
        (*(pvVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pvVar3,local_988,in_RDI + 0x1a8,2,2,local_9e0 + 1);
        DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0x149c745);
        MFInfo::~MFInfo((MFInfo *)0x149c752);
        BoxArray::~BoxArray(in_stack_ffffffffffffdcf0);
        IntVect::IntVect(&local_9ec,1);
        local_2cc = local_864;
        local_9ec.vect[local_864] = 0;
        local_2c8 = &local_9ec;
        pvVar3 = std::array<amrex::MultiFab,_3UL>::operator[]
                           ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)__n)
        ;
        convert(in_stack_ffffffffffffdd08,(IntVect *)in_stack_ffffffffffffdd00);
        local_a78._0_4_ = 0;
        local_a78._4_4_ = 0;
        pdStack_a70 = (double *)0x0;
        local_a90.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a90.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a68 = 0;
        MFInfo::MFInfo((MFInfo *)0x149c84f);
        local_a90.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        this_00 = &local_a90;
        DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffdcf0);
        (*(pvVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pvVar3,local_a58,in_RDI + 0x1a8,1,2,
                   &local_a90.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0x149c8c3);
        MFInfo::~MFInfo((MFInfo *)0x149c8d0);
        BoxArray::~BoxArray(in_stack_ffffffffffffdcf0);
      }
      local_a98 = local_348 + 0x448;
      local_aa0 = local_348 + 0x5c8;
      local_aa8 = local_348 + 0x748;
      local_ab0 = (double *)(local_348 + 0x8c8);
      local_ab8 = local_348 + 0xa48;
      local_ac0 = local_348 + 0xbc8;
      local_ac8 = local_348 + 0xd48;
      local_ad0 = local_348 + 0x11c8;
      local_ad8 = local_348 + 0x1648;
      if ((local_349 & 1) != 0) {
        local_ae0 = local_348;
        PVar6 = Geometry::periodicity(in_stack_ffffffffffffdd20);
        local_b08.vect._0_8_ = PVar6.period.vect._0_8_;
        local_af4._0_4_ = local_b08.vect[0];
        local_af4._4_4_ = local_b08.vect[1];
        local_b08.vect[2] = PVar6.period.vect[2];
        local_aec = local_b08.vect[2];
        local_ae8 = &local_af4;
        local_b08 = PVar6.period.vect;
        FabArray<amrex::EBCellFlagFab>::FillBoundary<amrex::EBCellFlag>
                  (in_stack_ffffffffffffdd10,(Periodicity *)in_stack_ffffffffffffdd08,
                   SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                   (Periodicity *)in_stack_ffffffffffffdd08,
                   SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                   (Periodicity *)in_stack_ffffffffffffdd08,
                   SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                   (Periodicity *)in_stack_ffffffffffffdd08,
                   SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                   (Periodicity *)in_stack_ffffffffffffdd08,
                   SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                   (Periodicity *)in_stack_ffffffffffffdd08,
                   SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        for (local_b0c = 0; local_b0c < 3; local_b0c = local_b0c + 1) {
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                     (Periodicity *)in_stack_ffffffffffffdd08,
                     SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                     (Periodicity *)in_stack_ffffffffffffdd08,
                     SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
          std::array<amrex::MultiFab,_3UL>::operator[]
                    ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdd10,
                     (Periodicity *)in_stack_ffffffffffffdd08,
                     SUB81((ulong)in_stack_ffffffffffffdd00 >> 0x38,0));
        }
        bVar2 = BoxArray::empty((BoxArray *)0x149cd4e);
        if (!bVar2) {
          Periodicity::shiftIntVect(in_stack_ffffffffffffdd48);
          local_b18 = local_b30;
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          vector((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )0x149cd90);
          MFIter::MFIter((MFIter *)in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
                         (uchar)((ulong)in_stack_ffffffffffffdd10 >> 0x38));
          while (bVar2 = MFIter::isValid(&local_ba8), bVar2) {
            MFIter::fabbox(in_stack_ffffffffffffdd00);
            local_bb0 = local_bcc;
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                       (MFIter *)in_stack_ffffffffffffdcf0);
            local_bd8 = local_c18;
            FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                      (in_stack_ffffffffffffdcf8,(MFIter *)in_stack_ffffffffffffdcf0);
            local_c20 = local_c60;
            std::array<amrex::MultiFab,_3UL>::operator[]
                      ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                       (MFIter *)in_stack_ffffffffffffdcf0);
            local_c68 = local_ca8;
            std::array<amrex::MultiFab,_3UL>::operator[]
                      ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                       (MFIter *)in_stack_ffffffffffffdcf0);
            local_cb0 = local_cf0;
            std::array<amrex::MultiFab,_3UL>::operator[]
                      ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                       (MFIter *)in_stack_ffffffffffffdcf0);
            local_cf8 = local_d38;
            local_d40 = local_b18;
            local_d48._M_current =
                 (IntVect *)
                 std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin(this_00);
            local_d50 = (IntVect *)
                        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end(this_00);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                       *)in_stack_ffffffffffffdcf0,
                                      (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                       *)this_00), bVar2) {
              local_d58 = __gnu_cxx::
                          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                          ::operator*(&local_d48);
              Box::operator+((Box *)in_stack_ffffffffffffdcf0,(IntVect *)this_00);
              BoxArray::intersections
                        ((BoxArray *)in_stack_ffffffffffffdd30,(Box *)in_stack_ffffffffffffdd28,
                         (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          *)in_stack_ffffffffffffdd20);
              local_d80 = local_b48;
              local_d88._M_current =
                   (pair<int,_amrex::Box> *)
                   std::
                   vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ::begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            *)this_00);
              local_d90 = (pair<int,_amrex::Box> *)
                          std::
                          vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ::end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                 *)this_00);
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                         *)in_stack_ffffffffffffdcf0,
                                        (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                         *)this_00), bVar2) {
                local_d98 = __gnu_cxx::
                            __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                            ::operator*(&local_d88);
                Box::operator-((Box *)in_stack_ffffffffffffdcf0,(IntVect *)this_00);
                local_da0 = &local_dbc;
                local_140 = &local_de4;
                for (local_144 = 0; local_144 < 3; local_144 = local_144 + 1) {
                  local_130 = local_dcc;
                  local_134 = local_144;
                  local_114 = local_144;
                  local_104 = local_144;
                  if ((local_dbc.btype.itype & 1 << ((byte)local_144 & 0x1f)) == 0) {
                    local_120 = aiStack_dd8;
                    local_124 = local_144;
                    local_128 = 1;
                    local_120[local_144] = local_120[local_144] + 1;
                  }
                  local_110 = local_130;
                }
                local_100 = local_dcc;
                local_dc8 = &local_de4;
                local_274 = 0;
                local_e0c.btype.itype = local_dbc.btype.itype;
                local_f0 = &local_e0c;
                local_f4 = 0;
                local_e0 = &local_e0c.btype;
                local_e4 = 0;
                local_c4 = 0;
                local_b8 = 0;
                if ((local_dbc.btype.itype & 1) == 0) {
                  local_d0 = &local_e0c.bigend;
                  local_d4 = 0;
                  local_d8 = 1;
                  local_b0 = &local_e0c.btype;
                  local_b4 = 0;
                  local_a8 = 0;
                  local_e0c.btype.itype = local_dbc.btype.itype | 1;
                }
                local_df0 = &local_e0c;
                local_284 = 1;
                local_e34.btype.itype = local_dbc.btype.itype;
                local_a0 = &local_e34;
                local_a4 = 1;
                local_90 = &local_e34.btype;
                local_94 = 1;
                local_74 = 1;
                local_68 = 1;
                if ((local_dbc.btype.itype & 2) == 0) {
                  local_80 = &local_e34.bigend;
                  local_84 = 1;
                  local_88 = 1;
                  local_60 = &local_e34.btype;
                  local_64 = 1;
                  local_58 = 1;
                  local_e34.btype.itype = local_dbc.btype.itype | 2;
                }
                local_e18 = &local_e34;
                local_294 = 2;
                local_e5c.btype.itype = local_dbc.btype.itype;
                local_50 = &local_e5c;
                local_54 = 2;
                local_40 = &local_e5c.btype;
                local_44 = 2;
                local_24 = 2;
                local_18 = 2;
                if ((local_dbc.btype.itype & 4) == 0) {
                  local_30 = &local_e5c.bigend;
                  local_34 = 2;
                  local_38 = 1;
                  local_10 = &local_e5c.btype;
                  local_14 = 2;
                  local_4 = 2;
                  local_e5c.btype.itype = local_dbc.btype.itype | 4;
                }
                local_e40 = &local_e5c;
                local_154 = 0;
                local_164 = 1;
                local_e68 = local_de4;
                iStack_e64 = iStack_de0;
                local_174 = 2;
                local_180 = aiStack_dd8;
                local_184 = 0;
                local_190 = aiStack_dd8;
                local_194 = 1;
                local_e84[0].y = aiStack_dd8[1];
                local_e84[0].x = aiStack_dd8[0];
                local_1a0 = aiStack_dd8;
                local_1a4 = 2;
                local_e84[0].z = aiStack_dd8[2];
                local_2a0 = local_da0;
                local_290 = local_da0;
                local_280 = local_da0;
                local_270 = local_da0;
                local_258 = local_dc8;
                local_230 = local_dc8;
                local_170 = local_dc8;
                local_160 = local_dc8;
                local_150 = local_dc8;
                local_c0 = local_e0;
                local_70 = local_90;
                local_20 = local_40;
                for (local_e9c = local_ddc; local_e9c <= local_e84[0].z; local_e9c = local_e9c + 1)
                {
                  for (local_ea0 = iStack_e64; local_ea0 <= local_e84[0].y;
                      local_ea0 = local_ea0 + 1) {
                    for (local_ea4 = local_e68; local_ea4 <= local_e84[0].x;
                        local_ea4 = local_ea4 + 1) {
                      IntVect::IntVect(&local_eb0,local_ea4,local_ea0,local_e9c);
                      bVar2 = Box::contains(local_da0,&local_eb0);
                      if (bVar2) {
                        local_1c8 = local_bd8;
                        local_1cc = local_ea4;
                        local_1d0 = local_ea0;
                        local_1d4 = local_e9c;
                        *(undefined8 *)
                         (*local_bd8 +
                         ((long)(local_ea4 - (int)local_bd8[4]) +
                          (long)(local_ea0 - *(int *)((long)local_bd8 + 0x24)) * local_bd8[1] +
                         (long)(local_e9c - (int)local_bd8[5]) * local_bd8[2]) * 8) = 0;
                        EBCellFlag::EBCellFlag(&local_1c0,0x40003);
                        local_eb4 = local_1c0.flag;
                        local_1b0 = local_c20;
                        local_1b4 = local_ea4;
                        local_1b8 = local_ea0;
                        local_1bc = local_e9c;
                        *(uint32_t *)
                         (*local_c20 +
                         ((long)(local_ea4 - (int)local_c20[4]) +
                          (long)(local_ea0 - *(int *)((long)local_c20 + 0x24)) * local_c20[1] +
                         (long)(local_e9c - (int)local_c20[5]) * local_c20[2]) * 4) = local_1c0.flag
                        ;
                      }
                      bVar2 = Box::contains(local_df0,&local_eb0);
                      if (bVar2) {
                        local_1e0 = local_c68;
                        local_1e4 = local_ea4;
                        local_1e8 = local_ea0;
                        local_1ec = local_e9c;
                        *(undefined8 *)
                         (*local_c68 +
                         ((long)(local_ea4 - (int)local_c68[4]) +
                          (long)(local_ea0 - *(int *)((long)local_c68 + 0x24)) * local_c68[1] +
                         (long)(local_e9c - (int)local_c68[5]) * local_c68[2]) * 8) = 0;
                      }
                      bVar2 = Box::contains(local_e18,&local_eb0);
                      if (bVar2) {
                        local_1f8 = local_cb0;
                        local_1fc = local_ea4;
                        local_200 = local_ea0;
                        local_204 = local_e9c;
                        *(undefined8 *)
                         ((long)*local_cb0 +
                         ((long)(local_ea4 - *(int *)(local_cb0 + 4)) +
                          (long)(local_ea0 - *(int *)((long)local_cb0 + 0x24)) * (long)local_cb0[1]
                         + (long)(local_e9c - *(int *)(local_cb0 + 5)) * (long)local_cb0[2]) * 8) =
                             0;
                      }
                      bVar2 = Box::contains(local_e40,&local_eb0);
                      if (bVar2) {
                        local_210 = local_cf8;
                        local_214 = local_ea4;
                        local_218 = local_ea0;
                        local_21c = local_e9c;
                        *(undefined8 *)
                         (*local_cf8 +
                         ((long)(local_ea4 - (int)local_cf8[4]) +
                          (long)(local_ea0 - *(int *)((long)local_cf8 + 0x24)) * local_cf8[1] +
                         (long)(local_e9c - (int)local_cf8[5]) * local_cf8[2]) * 8) = 0;
                      }
                    }
                  }
                }
                __gnu_cxx::
                __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                ::operator++(&local_d88);
              }
              __gnu_cxx::
              __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
              ::operator++(&local_d48);
            }
            MFIter::operator++(&local_ba8);
          }
          MFIter::~MFIter((MFIter *)in_stack_ffffffffffffdcf0);
          std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          ~vector((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   *)in_stack_ffffffffffffdd00);
          std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                     in_stack_ffffffffffffdd00);
        }
      }
      local_eb8 = 0;
      MFIter::MFIter((MFIter *)in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18,
                     SUB81((ulong)in_stack_ffffffffffffdd10 >> 0x38,0));
      while (bVar2 = MFIter::isValid((MFIter *)(local_f60 + 0x48)), bVar2) {
        in_stack_ffffffffffffdcf0 = (BoxArray *)local_f60;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        in_stack_ffffffffffffdcf8 = (FabArray<amrex::EBCellFlagFab> *)(local_ff0 + 0x48);
        local_f60._64_8_ = in_stack_ffffffffffffdcf0;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        this_01 = (MFIter *)local_ff0;
        local_f68 = in_stack_ffffffffffffdcf8;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        puVar7 = local_1038;
        local_ff0._64_8_ = this_01;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        puVar8 = local_1080;
        local_ff8 = puVar7;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        lVar5 = in_RDI + 0xd48;
        local_1040 = puVar8;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        puVar7 = (undefined8 *)(local_1158 + 0x90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1088 = puVar7;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        puVar9 = local_1158 + 0x48;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1158._136_8_ = puVar9;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        f = (anon_class_1960_32_a2ac1a33 *)local_1158;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1158._64_8_ = f;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        bx_00 = local_11a0;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1160 = bx_00;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        puVar9 = local_11e8;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_11a8 = puVar9;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        puVar9 = local_1230;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_11f0 = puVar9;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        puVar9 = local_1278;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1238 = puVar9;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        puVar9 = local_12c0;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1280 = puVar9;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_12c8 = local_1308;
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (in_stack_ffffffffffffdcf8,(MFIter *)in_stack_ffffffffffffdcf0);
        local_1310 = local_1350;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1358 = local_1398;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_13a0 = local_13e0;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_13e8 = local_1428;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1430 = local_1470;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1478 = local_14b8;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_14c0 = local_1500;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1508 = local_1548;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1550 = local_1590;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1598 = local_15d8;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_15e0 = local_1620;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1628 = local_1668;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1670 = local_16b0;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_16b8 = local_16f8;
        std::array<amrex::MultiFab,_3UL>::operator[]
                  ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffdcf0,(size_type)this_00);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffdcf8,
                   (MFIter *)in_stack_ffffffffffffdcf0);
        local_1700 = local_1740;
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (in_stack_ffffffffffffdcf8,(MFIter *)in_stack_ffffffffffffdcf0);
        local_1748 = local_1788;
        MFIter::validbox(this_01);
        local_1790 = local_17ac;
        MFIter::grownnodaltilebox((MFIter *)f,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
        local_17d8 = 0;
        uStack_1f78 = *local_1790;
        uStack_1f64 = *(undefined8 *)((long)local_1790 + 0x14);
        uStack_1f68 = (undefined4)((ulong)*(undefined8 *)((long)local_1790 + 0xc) >> 0x20);
        uStack_1f70 = (undefined4)local_1790[1];
        local_1f6c = (undefined4)((ulong)local_1790[1] >> 0x20);
        local_1f58 = *(undefined8 *)local_f60._64_8_;
        uStack_1f50 = *(undefined8 *)(local_f60._64_8_ + 8);
        local_1f48 = *(undefined8 *)(local_f60._64_8_ + 0x10);
        uStack_1f40 = *(undefined8 *)(local_f60._64_8_ + 0x18);
        uStack_1f38 = *(undefined8 *)(local_f60._64_8_ + 0x20);
        uStack_1f24 = *(undefined8 *)(local_f60._64_8_ + 0x34);
        uStack_1f28 = (undefined4)((ulong)*(undefined8 *)(local_f60._64_8_ + 0x2c) >> 0x20);
        uStack_1f30 = (undefined4)*(undefined8 *)(local_f60._64_8_ + 0x28);
        local_1f2c = (undefined4)((ulong)*(undefined8 *)(local_f60._64_8_ + 0x28) >> 0x20);
        local_1f18 = (local_f68->super_FabArrayBase)._vptr_FabArrayBase;
        uStack_1f10 = *(undefined8 *)&(local_f68->super_FabArrayBase).boxarray.m_bat;
        local_1f08 = *(undefined8 *)((long)&(local_f68->super_FabArrayBase).boxarray.m_bat.m_op + 4)
        ;
        uStack_1f00 = *(undefined8 *)
                       ((long)&(local_f68->super_FabArrayBase).boxarray.m_bat.m_op + 0xc);
        uStack_1ef8 = *(undefined8 *)
                       ((long)&(local_f68->super_FabArrayBase).boxarray.m_bat.m_op + 0x14);
        uVar1 = *(undefined8 *)((long)&(local_f68->super_FabArrayBase).boxarray.m_bat.m_op + 0x1c);
        uStack_1ee4 = *(undefined8 *)
                       ((long)&(local_f68->super_FabArrayBase).boxarray.m_bat.m_op + 0x28);
        uStack_1ee8 = (undefined4)
                      ((ulong)*(undefined8 *)
                               ((long)&(local_f68->super_FabArrayBase).boxarray.m_bat.m_op + 0x20)
                      >> 0x20);
        uStack_1ef0 = (undefined4)uVar1;
        local_1eec = (undefined4)((ulong)uVar1 >> 0x20);
        local_1ed8 = (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *
                       )local_ff0._64_8_)->_M_t).
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        pFStack_1ed0 = *(FabArrayBase **)(local_ff0._64_8_ + 8);
        local_1ec8 = *(undefined8 *)((IntVect *)(local_ff0._64_8_ + 0x10))->vect;
        uStack_1ec0 = *(undefined8 *)(((IntVect *)(local_ff0._64_8_ + 0x10))->vect + 2);
        uStack_1eb8 = *(undefined8 *)(local_ff0._64_8_ + 0x20);
        uStack_1ea4 = *(undefined8 *)(local_ff0._64_8_ + 0x34);
        uStack_1ea8 = (undefined4)((ulong)*(undefined8 *)(local_ff0._64_8_ + 0x2c) >> 0x20);
        uStack_1eb0 = (undefined4)*(undefined8 *)(local_ff0._64_8_ + 0x28);
        local_1eac = (undefined4)((ulong)*(undefined8 *)(local_ff0._64_8_ + 0x28) >> 0x20);
        local_1e98 = *local_ff8;
        uStack_1e90 = local_ff8[1];
        local_1e88 = local_ff8[2];
        uStack_1e80 = local_ff8[3];
        uStack_1e78 = local_ff8[4];
        uStack_1e64 = *(undefined8 *)((long)local_ff8 + 0x34);
        uStack_1e68 = (undefined4)((ulong)*(undefined8 *)((long)local_ff8 + 0x2c) >> 0x20);
        uStack_1e70 = (undefined4)local_ff8[5];
        local_1e6c = (undefined4)((ulong)local_ff8[5] >> 0x20);
        local_1e58 = *local_1040;
        uStack_1e50 = local_1040[1];
        local_1e48 = local_1040[2];
        uStack_1e40 = local_1040[3];
        uStack_1e38 = local_1040[4];
        uStack_1e24 = *(undefined8 *)((long)local_1040 + 0x34);
        uStack_1e28 = (undefined4)((ulong)*(undefined8 *)((long)local_1040 + 0x2c) >> 0x20);
        uStack_1e30 = (undefined4)local_1040[5];
        local_1e2c = (undefined4)((ulong)local_1040[5] >> 0x20);
        local_1e18 = *local_1088;
        in_stack_ffffffffffffe1f0 = (Level *)local_1088[1];
        local_1f80 = &local_17d8;
        local_17b8 = local_17d4;
        LoopOnCpu<amrex::EB2::Level::coarsenFromFine(amrex::EB2::Level&,bool)::__2>(bx_00,f);
        puVar4 = (uint *)std::max<int>((int *)&local_eb8,&local_17d8);
        local_eb8 = *puVar4;
        MFIter::operator++((MFIter *)(local_f60 + 0x48));
      }
      MFIter::~MFIter((MFIter *)in_stack_ffffffffffffdcf0);
      local_1f81 = local_eb8 != 0;
      ParallelDescriptor::ReduceBoolOr(&local_1f81);
      local_eb8 = (uint)(local_1f81 & 1);
      if (local_eb8 == 0) {
        buildCellFlag(in_stack_ffffffffffffe1f0);
      }
      local_334 = local_eb8;
    }
  }
  else {
    local_334 = 1;
  }
  return local_334;
}

Assistant:

int
Level::coarsenFromFine (Level& fineLevel, bool fill_boundary)
{
    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;
    const DistributionMapping& fine_dmap = fineLevel.m_dmap;
    m_grids = amrex::coarsen(fine_grids,2);
    m_covered_grids = amrex::coarsen(fine_covered_grids, 2);
    m_dmap = fine_dmap;

    if (! (fine_grids.coarsenable(2,2) &&
           (fine_covered_grids.empty() || fine_covered_grids.coarsenable(2,2)))) {
        return 1;
    }

    auto const& f_levelset = fineLevel.m_levelset;
    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    int mvmc_error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mvmc_error)
#endif
        for (MFIter mfi(m_levelset,true); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = mfi.tilebox(IntVect::TheCellVector());
            const Box& ndbx = mfi.tilebox();
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);

            amrex::LoopConcurrentOnCpu(ndbx,
            [=] (int i, int j, int k) noexcept
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
            });

            int tile_error = 0;
            amrex::LoopOnCpu(ccbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                int ierror = check_mvmc(i,j,k,fine);
                tile_error = std::max(tile_error,ierror);
            });

            mvmc_error = std::max(mvmc_error, tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_levelset); mfi.isValid(); ++mfi)
        {
            const Box& ndbx = mfi.validbox();
            const Box& ccbx = amrex::enclosedCells(ndbx);
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);
            reduce_op.eval(ndbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
                int ierror;
                if (ccbx.contains(IntVect{AMREX_D_DECL(i,j,k)})) {
                    ierror = check_mvmc(i,j,k,fine);
                } else {
                    ierror = 0;
                }
                return {ierror};
            });
        }
        ReduceTuple rv = reduce_data.value(reduce_op);
        mvmc_error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = mvmc_error;
        ParallelDescriptor::ReduceBoolOr(b);
        mvmc_error = b;
    }
    if (mvmc_error) return mvmc_error;

    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    m_volfrac.define(m_grids, m_dmap, 1, ng);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }

    auto& f_cellflag = fineLevel.m_cellflag;
    MultiFab& f_volfrac = fineLevel.m_volfrac;
    MultiFab& f_centroid = fineLevel.m_centroid;
    MultiFab& f_bndryarea = fineLevel.m_bndryarea;
    MultiFab& f_bndrycent = fineLevel.m_bndrycent;
    MultiFab& f_bndrynorm = fineLevel.m_bndrynorm;
    auto& f_areafrac = fineLevel.m_areafrac;
    auto& f_facecent = fineLevel.m_facecent;
    auto& f_edgecent = fineLevel.m_edgecent;

    if (fill_boundary)
    {
        const Geometry& fine_geom = fineLevel.m_geom;
        const auto& fine_period = fine_geom.periodicity();
        f_cellflag.FillBoundary(fine_period);
        f_volfrac.FillBoundary(fine_period);
        f_centroid.FillBoundary(fine_period);
        f_bndryarea.FillBoundary(fine_period);
        f_bndrycent.FillBoundary(fine_period);
        f_bndrynorm.FillBoundary(fine_period);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            f_areafrac[idim].FillBoundary(fine_period);
            f_facecent[idim].FillBoundary(fine_period);
            f_edgecent[idim].FillBoundary(fine_period);
        }

        if (!fine_covered_grids.empty())
        {
            const std::vector<IntVect>& pshifts = fine_period.shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(f_volfrac); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.fabbox();
                    auto const& vfrac = f_volfrac.array(mfi);
                    auto const& cflag = f_cellflag.array(mfi);
                    AMREX_D_TERM(auto const& apx = f_areafrac[0].array(mfi);,
                                 auto const& apy = f_areafrac[1].array(mfi);,
                                 auto const& apz = f_areafrac[2].array(mfi););

                    for (const auto& iv : pshifts)
                    {
                        fine_covered_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects)
                        {
                            Box const& ibox = is.second - iv;
                            Box const& indbox = amrex::surroundingNodes(ibox);
                            AMREX_D_TERM(auto const& xbx = amrex::surroundingNodes(ibox,0);,
                                         auto const& ybx = amrex::surroundingNodes(ibox,1);,
                                         auto const& zbx = amrex::surroundingNodes(ibox,2););
                            AMREX_HOST_DEVICE_FOR_3D(indbox, i,j,k,
                            {
                                IntVect cell(AMREX_D_DECL(i,j,k));
                                if (ibox.contains(cell)) {
                                    vfrac(i,j,k) = 0.0;
                                    cflag(i,j,k) = EBCellFlag::TheCoveredCell();
                                }
                                AMREX_D_TERM(if (xbx.contains(cell)) apx(i,j,k) = 0.0;,
                                             if (ybx.contains(cell)) apy(i,j,k) = 0.0;,
                                             if (zbx.contains(cell)) apz(i,j,k) = 0.0;);
                            });
                        }
                    }
                }
            }
        }
    }

    int error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:error)
#endif
        for (MFIter mfi(m_volfrac,true); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& ndgbx = mfi.grownnodaltilebox(-1,2);

            int tile_error = 0;
            amrex::LoopOnCpu(ndgbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                tile_error = std::max(tile_error,ierr);
            });

            error = std::max(error,tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_volfrac); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& gbx = amrex::grow(bx,2);
            Box const& ndgbx = amrex::surroundingNodes(gbx);

            reduce_op.eval(ndgbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                return {ierr};
            });
        }

        ReduceTuple rv = reduce_data.value(reduce_op);
        error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = error;
        ParallelDescriptor::ReduceBoolOr(b);
        error = b;
    }

    if (!error) {
        buildCellFlag();
    }

    return error;
}